

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O2

HalfCycles __thiscall
Enterprise::ConcreteMachine<true,_false>::perform_machine_cycle
          (ConcreteMachine<true,_false> *this,PartialMachineCycle *cycle)

{
  EXDos *this_00;
  byte *pbVar1;
  Typer *this_01;
  bool bVar2;
  uint8_t uVar3;
  uint uVar4;
  Cycles CVar5;
  long lVar6;
  ssize_t sVar7;
  byte bVar8;
  size_t sVar9;
  void *__buf;
  ulong uVar10;
  ushort uVar11;
  uint __fd;
  char *format;
  ulong uVar12;
  int iVar13;
  unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
  uVar14;
  undefined1 local_58 [16];
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_48;
  _Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false> local_38;
  
  if (cycle->address == (ushort *)0x0) {
    __fd = 0;
  }
  else {
    __fd = (uint)*cycle->address;
  }
  uVar11 = (ushort)__fd;
  uVar12 = (ulong)uVar11;
  local_48._M_head_impl =
       (Flywheel *)
       (_Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>)0x0
  ;
  switch(cycle->operation) {
  case Read:
    uVar10 = (ulong)(uVar11 >> 0xe);
    goto LAB_00301a01;
  case Write:
    uVar10 = (ulong)(uVar11 >> 0xe);
    if (this->is_video_[uVar10] == true) {
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::flush(&this->nick_);
    }
LAB_00301a01:
    if (this->is_video_[uVar10] == true) {
LAB_00301a10:
      lVar6 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + 1;
LAB_00301a1a:
      CVar5 = Nick::get_time_until_z80_slot(&(this->nick_).object_,(Cycles)(lVar6 / 0xad5700));
      lVar6 = (lVar6 / 0xad5700) * 0x15aae00 +
              (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      local_48._M_head_impl =
           (Flywheel *)
           (((long)CVar5.super_WrappedInt<Cycles>.length_ * 0x15aae00 + lVar6 + 0xad56ff) /
            0x268fbab + lVar6 / -0x268fbab);
    }
    else {
LAB_00301aa7:
      local_48._M_head_impl = (Flywheel *)0x0;
    }
    break;
  case Input:
  case Output:
    if ((uVar11 & 0xf0) != 0x80) goto LAB_00301aa7;
    goto LAB_00301a10;
  case ReadOpcodeStart:
    if (this->is_video_[uVar11 >> 0xe] != true) {
      if (this->wait_mode_ != None) goto LAB_00301a9e;
      goto LAB_00301aa7;
    }
    lVar6 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + 2;
    goto LAB_00301a1a;
  case ReadStart:
  case WriteStart:
    local_48._M_head_impl = (Flywheel *)0x0;
    if ((this->is_video_[uVar11 >> 0xe] == false) &&
       (local_48._M_head_impl = (Flywheel *)0x0, this->wait_mode_ == OnAllAccesses)) {
LAB_00301a9e:
      local_48._M_head_impl = (Flywheel *)(this->dave_delay_).super_WrappedInt<HalfCycles>.length_;
    }
  }
  CVar5.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)
       ((long)&(local_48._M_head_impl)->standard_period_ +
       (cycle->length).super_WrappedInt<HalfCycles>.length_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)CVar5.super_WrappedInt<Cycles>.length_;
  advance_nick(this,(HalfCycles)CVar5.super_WrappedInt<Cycles>.length_);
  bVar2 = JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator+=
                    (&this->dave_timer_,(HalfCycles)CVar5.super_WrappedInt<Cycles>.length_);
  if (bVar2) {
    uVar3 = Dave::TimedInterruptSource::get_new_interrupts(&(this->dave_timer_).object_);
    set_interrupts(this,uVar3,
                   (HalfCycles)
                   (this->dave_timer_).time_overrun_.super_WrappedInt<HalfCycles>.length_);
  }
  this_00 = &this->exdos_;
  WD::WD1770::run_for(&this_00->super_WD1770,CVar5);
  switch(cycle->operation) {
  case ReadOpcode:
  case Read:
    if (this->read_pointers_[uVar11 >> 0xe] != (uint8_t *)0x0) {
      uVar3 = this->read_pointers_[uVar11 >> 0xe][uVar12];
      goto LAB_00301b51;
    }
  case Interrupt:
switchD_00301b2f_caseD_5:
    *cycle->value = 0xff;
    return (HalfCycles)local_48._M_head_impl;
  case Write:
    if (this->write_pointers_[uVar11 >> 0xe] != (uint8_t *)0x0) {
      this->write_pointers_[uVar11 >> 0xe][uVar12] = *cycle->value;
      return (HalfCycles)local_48._M_head_impl;
    }
    return (HalfCycles)local_48._M_head_impl;
  case Input:
    uVar4 = __fd & 0xff;
    if (0x36 < uVar4 - 0x80) {
      if (uVar4 - 0x10 < 8) {
        sVar7 = WD::WD1770::read(&this_00->super_WD1770,__fd,__buf,(ulong)(uVar4 - 0x10));
        uVar3 = (uint8_t)sVar7;
        goto LAB_00301b51;
      }
      if (uVar4 - 0x18 < 8) {
        uVar3 = EXDos::get_control_register(this_00);
        goto LAB_00301b51;
      }
switchD_00301bf0_caseD_90:
      Log::Logger<(Log::Source)12>::error((Logger<(Log::Source)12> *)local_58);
      Log::Logger<(Log::Source)12>::LogLine::append
                ((LogLine *)local_58,"Unhandled input from %02x",uVar12 & 0xff);
      Log::Logger<(Log::Source)12>::LogLine::~LogLine((LogLine *)local_58);
      goto switchD_00301b2f_caseD_5;
    }
    sVar9 = (long)&switchD_00301bf0::switchdataD_004632e4 +
            (long)(int)(&switchD_00301bf0::switchdataD_004632e4)[uVar4 - 0x80];
    switch(uVar4) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      iVar13 = (int)this + 0x60500;
      uVar14 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                         ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)
                          local_58);
      sVar7 = Nick::read((Nick *)local_58._8_8_,iVar13,
                         uVar14._M_t.
                         super___uniq_ptr_impl<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_Enterprise::Nick_*,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                         .super__Head_base<0UL,_Enterprise::Nick_*,_false>._M_head_impl,sVar9);
      *cycle->value = (uint8_t)sVar7;
      goto LAB_00301c19;
    default:
      goto switchD_00301bf0_caseD_90;
    case 0xb0:
      uVar3 = this->pages_[0];
      break;
    case 0xb1:
      uVar3 = this->pages_[1];
      break;
    case 0xb2:
      uVar3 = this->pages_[2];
      break;
    case 0xb3:
      uVar3 = this->pages_[3];
      break;
    case 0xb4:
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_58);
      bVar2 = *(bool *)(local_58._8_8_ + 0x120);
      JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
                ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)
                 &stack0xffffffffffffffc0);
      bVar8 = Dave::TimedInterruptSource::get_divider_state(local_38._M_head_impl);
      *cycle->value = bVar8 | bVar2 << 4 | this->interrupt_state_;
      std::
      unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                     *)&stack0xffffffffffffffc0);
LAB_00301c19:
      std::
      unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                     *)local_58);
      return (HalfCycles)local_48._M_head_impl;
    case 0xb5:
      if (9 < (ulong)this->active_key_line_) goto switchD_00301b2f_caseD_5;
      uVar3 = (this->key_lines_)._M_elems[this->active_key_line_];
      break;
    case 0xb6:
      goto switchD_00301b2f_caseD_5;
    }
LAB_00301b51:
    *cycle->value = uVar3;
    return (HalfCycles)local_48._M_head_impl;
  case Output:
    uVar4 = __fd & 0xff;
    if (0x3f < uVar4 - 0x80) {
      if (uVar4 - 0x10 < 8) {
        WD::WD1770::write(&this_00->super_WD1770,__fd,(void *)(ulong)*cycle->value,
                          (ulong)(uVar4 - 0x10));
        return (HalfCycles)local_48._M_head_impl;
      }
      if (uVar4 - 0x18 < 8) {
        EXDos::set_control_register(this_00,*cycle->value);
        return (HalfCycles)local_48._M_head_impl;
      }
switchD_00301ba6_caseD_90:
      Log::Logger<(Log::Source)12>::error((Logger<(Log::Source)12> *)local_58);
      Log::Logger<(Log::Source)12>::LogLine::append
                ((LogLine *)local_58,"Unhandled output: %02x to %02x",(ulong)*cycle->value,
                 uVar12 & 0xff);
      goto LAB_00301f5a;
    }
    break;
  default:
    goto switchD_00301b2f_default;
  }
  sVar9 = (long)&switchD_00301ba6::switchdataD_004631e4 +
          (long)(int)(&switchD_00301ba6::switchdataD_004631e4)[uVar4 - 0x80];
  switch(uVar4) {
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
              ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_58);
    Nick::write((Nick *)local_58._8_8_,__fd,(void *)(ulong)*cycle->value,sVar9);
    goto LAB_00301c19;
  default:
    goto switchD_00301ba6_caseD_90;
  case 0xb0:
    ConcreteMachine<true,false>::page<0ul>((ConcreteMachine<true,false> *)this,*cycle->value);
    break;
  case 0xb1:
    ConcreteMachine<true,false>::page<1ul>((ConcreteMachine<true,false> *)this,*cycle->value);
    break;
  case 0xb2:
    ConcreteMachine<true,false>::page<2ul>((ConcreteMachine<true,false> *)this,*cycle->value);
    break;
  case 0xb3:
    ConcreteMachine<true,false>::page<3ul>((ConcreteMachine<true,false> *)this,*cycle->value);
    break;
  case 0xb4:
    pbVar1 = cycle->value;
    this->interrupt_mask_ = *pbVar1 & 0x55;
    this->interrupt_state_ = this->interrupt_state_ & ~*pbVar1;
    update_interrupts(this,(HalfCycles)0x0);
    break;
  case 0xb5:
    if ((this->active_key_line_ == '\t') && ((*cycle->value & 0xf) == 0)) {
      if (this->should_skip_splash_screen_ == false) {
        this_01 = (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
                  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
                  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
                  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
        if (this_01 != (Typer *)0x0) {
          iVar13 = this->typer_delay_;
          if (iVar13 != 0) goto LAB_00301f92;
          bVar2 = Utility::Typer::type_next_character(this_01);
          if (!bVar2) {
            (this->key_lines_)._M_elems[8] = 0xff;
            (this->key_lines_)._M_elems[9] = 0xff;
            (this->key_lines_)._M_elems[0] = 0xff;
            (this->key_lines_)._M_elems[1] = 0xff;
            (this->key_lines_)._M_elems[2] = 0xff;
            (this->key_lines_)._M_elems[3] = 0xff;
            (this->key_lines_)._M_elems[4] = 0xff;
            (this->key_lines_)._M_elems[5] = 0xff;
            (this->key_lines_)._M_elems[6] = 0xff;
            (this->key_lines_)._M_elems[7] = 0xff;
            std::__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>::reset
                      ((__uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_> *)
                       &(this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_,(pointer)0x0
                      );
          }
        }
      }
      else {
        iVar13 = this->typer_delay_;
        bVar8 = (this->key_lines_)._M_elems[8];
        if (iVar13 == 0) {
          (this->key_lines_)._M_elems[8] = bVar8 | 0x40;
          this->typer_delay_ = 0x3c;
          this->should_skip_splash_screen_ = false;
        }
        else {
          (this->key_lines_)._M_elems[8] = bVar8 & 0xbf;
LAB_00301f92:
          this->typer_delay_ = iVar13 + -1;
        }
      }
    }
    this->active_key_line_ = *cycle->value & 0xf;
    break;
  case 0xb6:
    Log::Logger<(Log::Source)12>::info((Logger<(Log::Source)12> *)local_58);
    bVar8 = *cycle->value;
    format = "TODO: printer output: %02x";
    goto LAB_00301f50;
  case 0xb7:
    Log::Logger<(Log::Source)12>::info((Logger<(Log::Source)12> *)local_58);
    bVar8 = *cycle->value;
    format = "TODO: serial output: %02x";
LAB_00301f50:
    Log::Logger<(Log::Source)12>::LogLine::append((LogLine *)local_58,format,(ulong)bVar8);
LAB_00301f5a:
    Log::Logger<(Log::Source)12>::LogLine::~LogLine((LogLine *)local_58);
    break;
  case 0xbf:
    pbVar1 = cycle->value;
    bVar8 = *pbVar1 >> 2 & 3;
    sVar9 = 2;
    if (bVar8 != 0) {
      sVar9 = (ulong)(bVar8 == 1);
    }
    this->wait_mode_ = (WaitMode)sVar9;
    (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = (ulong)(*pbVar1 & 2) + 2;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
    update_audio(this);
    Dave::Audio::write(&this->dave_audio_,__fd,(void *)(ulong)*cycle->value,sVar9);
    JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
              ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)local_58
              );
    Dave::TimedInterruptSource::write
              ((TimedInterruptSource *)local_58._8_8_,__fd,(void *)(ulong)*cycle->value,sVar9);
    std::
    unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                   *)local_58);
  }
switchD_00301b2f_default:
  return (HalfCycles)(WrappedInt<HalfCycles>)local_48._M_head_impl;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			using PartialMachineCycle = CPU::Z80::PartialMachineCycle;
			const uint16_t address = cycle.address ? *cycle.address : 0x0000;

			// Calculate an access penalty, if applicable.
			//
			// Rule applied here, which is slightly inferred:
			//
			//	Non-video reads and writes are delayed by exactly a cycle or not delayed at all,
			//	depending on the programmer's configuration of Dave.
			//
			//	Video reads and writes, and Nick port accesses, are delayed so that the last
			//	clock cycle of the machine cycle falls wholly inside the designated Z80 access
			//	window, per Nick.
			//
			// The switch statement below just attempts to implement that logic.
			//
			HalfCycles penalty;
			switch(cycle.operation) {
				default: break;

				// For non-video pauses, insert during the initial part of the bus cycle.
				case PartialMachineCycle::ReadStart:
				case PartialMachineCycle::WriteStart:
					if(!is_video_[address >> 14] && wait_mode_ == WaitMode::OnAllAccesses) {
						penalty = dave_delay_;
					}
				break;
				case PartialMachineCycle::ReadOpcodeStart: {
					if(is_video_[address >> 14]) {
						// Query Nick for the amount of delay that would occur with one cycle left
						// in this read opcode.
						const auto delay_time = nick_.time_since_flush(HalfCycles(2));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					} else if(wait_mode_ != WaitMode::None) {
						penalty = dave_delay_;
					}
				} break;

				// Video pauses: insert right at the end of the bus cycle.
				case PartialMachineCycle::Write:
					// Ensure all video that should have been collected prior to
					// this write has been.
					if(is_video_[address >> 14]) {
						nick_.flush();
					}
					[[fallthrough]];

				case PartialMachineCycle::Read:
					if(is_video_[address >> 14]) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				break;

				case PartialMachineCycle::Input:
				case PartialMachineCycle::Output: {
					if((address & 0xf0) == 0x80) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				}
			}

			const HalfCycles full_length = cycle.length + penalty;
			time_since_audio_update_ += full_length;
			advance_nick(full_length);
			if(dave_timer_ += full_length) {
				set_interrupts(dave_timer_.last_valid()->get_new_interrupts(), dave_timer_.last_sequence_point_overrun());
			}

			// The WD/etc runs at a nominal 8Mhz.
			if constexpr (has_disk_controller) {
				exdos_.run_for(Cycles(full_length.as_integral()));
			}

			switch(cycle.operation) {
				default: break;

				case PartialMachineCycle::Interrupt:
					*cycle.value = 0xff;
				break;

				case PartialMachineCycle::Input:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled input from %02x", address & 0xff);
							*cycle.value = 0xff;
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.read(address);
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.get_control_register();
							} else {
								*cycle.value = 0xff;
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							*cycle.value = nick_->read();
						break;

						case 0xb0:	*cycle.value = pages_[0];	break;
						case 0xb1:	*cycle.value = pages_[1];	break;
						case 0xb2:	*cycle.value = pages_[2];	break;
						case 0xb3:	*cycle.value = pages_[3];	break;

						case 0xb4:
							*cycle.value =
								(nick_->get_interrupt_line() ? 0x10 : 0x00) |
								dave_timer_->get_divider_state() |
								interrupt_state_;
						break;
						case 0xb5:
							if(active_key_line_ < key_lines_.size()) {
								*cycle.value = key_lines_[active_key_line_];
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0xb6: {
							// TODO: selected keyboard row, 0 to 9, should return one bit of joystick
							// input. That being the case:
							//
							//	b0:		joystick input
							//	b1, b2:	unused (in theory read from control port, but not used by any hardware)
							//	b3:		0 = printer ready; 1 = not ready
							//	b4:		serial, data in
							//	b5:		serial, status in
							//	b6:		tape input volume level, 0 = high, 1 = low
							//	b7:		tape data input
							*cycle.value = 0xff;
						} break;
					}
				break;

				case PartialMachineCycle::Output:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled output: %02x to %02x", *cycle.value, address & 0xff);
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr(has_disk_controller) {
								exdos_.write(address, *cycle.value);
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr(has_disk_controller) {
								exdos_.set_control_register(*cycle.value);
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							nick_->write(address, *cycle.value);
						break;

						case 0xb0:	page<0>(*cycle.value);	break;
						case 0xb1:	page<1>(*cycle.value);	break;
						case 0xb2:	page<2>(*cycle.value);	break;
						case 0xb3:	page<3>(*cycle.value);	break;

						case 0xbf:
							switch((*cycle.value >> 2)&3) {
								default:	wait_mode_ = WaitMode::None;			break;
								case 0:		wait_mode_ = WaitMode::OnAllAccesses;	break;
								case 1:		wait_mode_ = WaitMode::OnM1;			break;
							}

							// Dave delays (i.e. those affecting memory areas not associated with Nick)
							// are one cycle in 8Mhz mode, two cycles in 12Mhz mode.
							dave_delay_ = HalfCycles(2 + ((*cycle.value)&2));

							[[fallthrough]];

						case 0xa0:	case 0xa1:	case 0xa2:	case 0xa3:
						case 0xa4:	case 0xa5:	case 0xa6:	case 0xa7:
						case 0xa8:	case 0xa9:	case 0xaa:	case 0xab:
						case 0xac:	case 0xad:	case 0xae:	case 0xaf:
							update_audio();
							dave_audio_.write(address, *cycle.value);
							dave_timer_->write(address, *cycle.value);
						break;

						case 0xb4:
							interrupt_mask_ = *cycle.value & 0x55;
							interrupt_state_ &= ~*cycle.value;
							update_interrupts();
						break;
						case 0xb5:
							// Logic here: the ROM scans the keyboard by checking ascending
							// lines. It also seems to provide a line of 0 when using port B5
							// for non-keyboard uses.
							//
							// So: use the rollover from line 9 back to line 0 as a trigger to
							// spot that a scan of the keyboard just finished. Which makes it
							// time to enqueue the next keypress.
							//
							// Re: should_skip_splash_screen_ and typer_delay_, assume that a
							// single keypress is necessary to get past the Enterprise splash
							// screen, then a pause in keypressing while BASIC or whatever
							// starts up, then presses can resume.
							if(active_key_line_ == 9 && !(*cycle.value & 0xf) && (should_skip_splash_screen_ || typer_)) {
								if(should_skip_splash_screen_) {
									set_key_state(uint16_t(Key::Space), typer_delay_);
									if(typer_delay_) {
										--typer_delay_;
									} else {
										typer_delay_ = 60;
										should_skip_splash_screen_ = false;
									}
								} else {
									if(!typer_delay_) {
										if(!typer_->type_next_character()) {
											clear_all_keys();
											typer_ = nullptr;
										}
									} else {
										--typer_delay_;
									}
								}
							}

							active_key_line_ = *cycle.value & 0xf;
							// TODO:
							//
							//	b4:	strobe output for printer
							//	b5:	tape sound control (?)
							//	b6:	tape motor control 1, 1 = on
							//	b7: tape motor control 2, 1 = on
						break;
						case 0xb6:
							// Just 8 bits of printer data.
							logger.info().append("TODO: printer output: %02x", *cycle.value);
						break;
						case 0xb7:
							// b0 = serial data out
							// b1 = serial status out
							logger.info().append("TODO: serial output: %02x", *cycle.value);
						break;
					}
				break;

				case PartialMachineCycle::Read:
				case PartialMachineCycle::ReadOpcode:
					if(read_pointers_[address >> 14]) {
						*cycle.value = read_pointers_[address >> 14][address];
					} else {
						*cycle.value = 0xff;
					}
				break;

				case PartialMachineCycle::Write:
					if(write_pointers_[address >> 14]) {
						write_pointers_[address >> 14][address] = *cycle.value;
					}
				break;
			}

			return penalty;
		}